

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# survey.c
# Opt level: O0

int main(void)

{
  FILE *pFVar1;
  int sock;
  int iVar2;
  int sock_00;
  int iVar3;
  int *piVar4;
  char *pcVar5;
  uint *puVar6;
  bool bVar7;
  undefined1 local_2b [7];
  char cStack_24;
  char buf [7];
  int deadline;
  int respondent3;
  int respondent2;
  int respondent1;
  int surveyor;
  int rc;
  
  sock = test_socket_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/survey.c"
                          ,0x2a,1,0x62);
  cStack_24 = -0xc;
  buf[0] = '\x01';
  buf[1] = '\0';
  buf[2] = '\0';
  iVar2 = nn_setsockopt(sock,0x62,1,&stack0xffffffffffffffdc,4);
  pFVar1 = _stderr;
  if (iVar2 != 0) {
    piVar4 = __errno_location();
    pcVar5 = nn_err_strerror(*piVar4);
    puVar6 = (uint *)__errno_location();
    fprintf(pFVar1,"%s [%d] (%s:%d)\n",pcVar5,(ulong)*puVar6,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/survey.c"
            ,0x2e);
    fflush(_stderr);
    nn_err_abort();
  }
  test_bind_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/survey.c"
                 ,0x2f,sock,"inproc://test");
  iVar2 = test_socket_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/survey.c"
                           ,0x30,1,99);
  test_connect_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/survey.c"
                    ,0x31,iVar2,"inproc://test");
  sock_00 = test_socket_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/survey.c"
                             ,0x32,1,99);
  test_connect_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/survey.c"
                    ,0x33,sock_00,"inproc://test");
  buf._3_4_ = test_socket_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/survey.c"
                               ,0x34,1,99);
  test_connect_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/survey.c"
                    ,0x35,buf._3_4_,"inproc://test");
  iVar3 = nn_recv(sock,local_2b,7,0);
  bVar7 = false;
  if (iVar3 == -1) {
    iVar3 = nn_errno();
    bVar7 = iVar3 == 0x9523dfe;
  }
  pFVar1 = _stderr;
  if (!bVar7) {
    piVar4 = __errno_location();
    pcVar5 = nn_err_strerror(*piVar4);
    puVar6 = (uint *)__errno_location();
    fprintf(pFVar1,"%s [%d] (%s:%d)\n",pcVar5,(ulong)*puVar6,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/survey.c"
            ,0x39);
    fflush(_stderr);
    nn_err_abort();
  }
  test_send_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/survey.c"
                 ,0x3c,sock,"ABC");
  test_recv_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/survey.c"
                 ,0x3f,iVar2,"ABC");
  test_send_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/survey.c"
                 ,0x40,iVar2,"DEF");
  test_recv_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/survey.c"
                 ,0x43,sock_00,"ABC");
  test_send_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/survey.c"
                 ,0x44,sock_00,"DEF");
  test_recv_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/survey.c"
                 ,0x47,sock,"DEF");
  test_recv_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/survey.c"
                 ,0x48,sock,"DEF");
  iVar3 = nn_recv(sock,local_2b,7,0);
  bVar7 = false;
  if (iVar3 == -1) {
    iVar3 = nn_errno();
    bVar7 = iVar3 == 0x6e;
  }
  pFVar1 = _stderr;
  if (!bVar7) {
    piVar4 = __errno_location();
    pcVar5 = nn_err_strerror(*piVar4);
    puVar6 = (uint *)__errno_location();
    fprintf(pFVar1,"%s [%d] (%s:%d)\n",pcVar5,(ulong)*puVar6,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/survey.c"
            ,0x4c);
    fflush(_stderr);
    nn_err_abort();
  }
  test_recv_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/survey.c"
                 ,0x4f,buf._3_4_,"ABC");
  test_send_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/survey.c"
                 ,0x50,buf._3_4_,"GHI");
  test_send_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/survey.c"
                 ,0x53,sock,"ABC");
  iVar3 = nn_recv(sock,local_2b,7,0);
  bVar7 = false;
  if (iVar3 == -1) {
    iVar3 = nn_errno();
    bVar7 = iVar3 == 0x6e;
  }
  pFVar1 = _stderr;
  if (!bVar7) {
    piVar4 = __errno_location();
    pcVar5 = nn_err_strerror(*piVar4);
    puVar6 = (uint *)__errno_location();
    fprintf(pFVar1,"%s [%d] (%s:%d)\n",pcVar5,(ulong)*puVar6,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/survey.c"
            ,0x57);
    fflush(_stderr);
    nn_err_abort();
  }
  iVar3 = nn_recv(sock,local_2b,7,0);
  bVar7 = false;
  if (iVar3 == -1) {
    iVar3 = nn_errno();
    bVar7 = iVar3 == 0x9523dfe;
  }
  pFVar1 = _stderr;
  if (!bVar7) {
    piVar4 = __errno_location();
    pcVar5 = nn_err_strerror(*piVar4);
    puVar6 = (uint *)__errno_location();
    fprintf(pFVar1,"%s [%d] (%s:%d)\n",pcVar5,(ulong)*puVar6,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/survey.c"
            ,0x5b);
    fflush(_stderr);
    nn_err_abort();
  }
  test_close_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/survey.c"
                  ,0x5d,sock);
  test_close_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/survey.c"
                  ,0x5e,iVar2);
  test_close_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/survey.c"
                  ,0x5f,sock_00);
  test_close_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/survey.c"
                  ,0x60,buf._3_4_);
  return 0;
}

Assistant:

int main ()
{
    int rc;
    int surveyor;
    int respondent1;
    int respondent2;
    int respondent3;
    int deadline;
    char buf [7];

    /*  Test a simple survey with three respondents. */
    surveyor = test_socket (AF_SP, NN_SURVEYOR);
    deadline = 500;
    rc = nn_setsockopt (surveyor, NN_SURVEYOR, NN_SURVEYOR_DEADLINE,
        &deadline, sizeof (deadline));
    errno_assert (rc == 0);
    test_bind (surveyor, SOCKET_ADDRESS);
    respondent1 = test_socket (AF_SP, NN_RESPONDENT);
    test_connect (respondent1, SOCKET_ADDRESS);
    respondent2 = test_socket (AF_SP, NN_RESPONDENT);
    test_connect (respondent2, SOCKET_ADDRESS);
    respondent3 = test_socket (AF_SP, NN_RESPONDENT);
    test_connect (respondent3, SOCKET_ADDRESS);

    /* Check that attempt to recv with no survey pending is EFSM. */
    rc = nn_recv (surveyor, buf, sizeof (buf), 0);
    errno_assert (rc == -1 && nn_errno () == EFSM);

    /*  Send the survey. */
    test_send (surveyor, "ABC");

    /*  First respondent answers. */
    test_recv (respondent1, "ABC");
    test_send (respondent1, "DEF");

    /*  Second respondent answers. */
    test_recv (respondent2, "ABC");
    test_send (respondent2, "DEF");

    /*  Surveyor gets the responses. */
    test_recv (surveyor, "DEF");
    test_recv (surveyor, "DEF");

    /*  There are no more responses. Surveyor hits the deadline. */
    rc = nn_recv (surveyor, buf, sizeof (buf), 0);
    errno_assert (rc == -1 && nn_errno () == ETIMEDOUT);

    /*  Third respondent answers (it have already missed the deadline). */
    test_recv (respondent3, "ABC");
    test_send (respondent3, "GHI");

    /*  Surveyor initiates new survey. */
    test_send (surveyor, "ABC");

    /*  Check that stale response from third respondent is not delivered. */
    rc = nn_recv (surveyor, buf, sizeof (buf), 0);
    errno_assert (rc == -1 && nn_errno () == ETIMEDOUT);

    /* Check that subsequent attempt to recv with no survey pending is EFSM. */
    rc = nn_recv (surveyor, buf, sizeof (buf), 0);
    errno_assert (rc == -1 && nn_errno () == EFSM);

    test_close (surveyor);
    test_close (respondent1);
    test_close (respondent2);
    test_close (respondent3);

    return 0;
}